

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

bool __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iterator::operator==(iterator *this,iterator other)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0x67,
                  "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
                 );
  }
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 ==
      (long)(pcVar1->Data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->Data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    if (pcVar1 == other.Tree) {
      return this->Position == other.Position;
    }
    __assert_fail("this->Tree == other.Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0x69,
                  "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
                 );
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                ,0x68,
                "bool cmLinkedTree<std::basic_string<char>>::iterator::operator==(iterator) const [T = std::basic_string<char>]"
               );
}

Assistant:

bool operator==(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Tree == other.Tree);
      return this->Position == other.Position;
    }